

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void * xmlHashQLookup3(xmlHashTablePtr table,xmlChar *prefix,xmlChar *name,xmlChar *prefix2,
                      xmlChar *name2,xmlChar *prefix3,xmlChar *name3)

{
  int iVar1;
  byte *pbVar2;
  ulong uVar3;
  xmlChar *pxVar4;
  xmlChar xVar5;
  _xmlHashEntry *p_Var6;
  
  if (name != (xmlChar *)0x0 && table != (xmlHashTablePtr)0x0) {
    pbVar2 = prefix;
    if (prefix == (xmlChar *)0x0) {
      pbVar2 = name;
    }
    uVar3 = (ulong)*pbVar2 * 0x20 + (ulong)*pbVar2 * -2 + (long)table->random_seed;
    if (prefix != (xmlChar *)0x0) {
      xVar5 = *prefix;
      if (xVar5 != '\0') {
        pxVar4 = prefix + 1;
        do {
          uVar3 = uVar3 ^ (long)(char)xVar5 + (uVar3 >> 3) + uVar3 * 0x20;
          xVar5 = *pxVar4;
          pxVar4 = pxVar4 + 1;
        } while (xVar5 != '\0');
      }
      uVar3 = uVar3 ^ uVar3 * 0x20 + (uVar3 >> 3) + 0x3a;
    }
    xVar5 = *name;
    if (xVar5 != '\0') {
      pxVar4 = name + 1;
      do {
        uVar3 = uVar3 ^ (long)(char)xVar5 + (uVar3 >> 3) + uVar3 * 0x20;
        xVar5 = *pxVar4;
        pxVar4 = pxVar4 + 1;
      } while (xVar5 != '\0');
    }
    uVar3 = (uVar3 >> 3) + uVar3 * 0x20 ^ uVar3;
    if (prefix2 != (xmlChar *)0x0) {
      xVar5 = *prefix2;
      if (xVar5 != '\0') {
        pxVar4 = prefix2 + 1;
        do {
          uVar3 = uVar3 ^ (long)(char)xVar5 + (uVar3 >> 3) + uVar3 * 0x20;
          xVar5 = *pxVar4;
          pxVar4 = pxVar4 + 1;
        } while (xVar5 != '\0');
      }
      uVar3 = uVar3 ^ uVar3 * 0x20 + (uVar3 >> 3) + 0x3a;
    }
    if ((name2 != (xmlChar *)0x0) && (xVar5 = *name2, xVar5 != '\0')) {
      pxVar4 = name2 + 1;
      do {
        uVar3 = uVar3 ^ (long)(char)xVar5 + (uVar3 >> 3) + uVar3 * 0x20;
        xVar5 = *pxVar4;
        pxVar4 = pxVar4 + 1;
      } while (xVar5 != '\0');
    }
    uVar3 = (uVar3 >> 3) + uVar3 * 0x20 ^ uVar3;
    if (prefix3 != (xmlChar *)0x0) {
      xVar5 = *prefix3;
      if (xVar5 != '\0') {
        pxVar4 = prefix3 + 1;
        do {
          uVar3 = uVar3 ^ (long)(char)xVar5 + (uVar3 >> 3) + uVar3 * 0x20;
          xVar5 = *pxVar4;
          pxVar4 = pxVar4 + 1;
        } while (xVar5 != '\0');
      }
      uVar3 = uVar3 ^ uVar3 * 0x20 + (uVar3 >> 3) + 0x3a;
    }
    if (name3 != (xmlChar *)0x0) {
      xVar5 = *name3;
      pxVar4 = name3;
      while (xVar5 != '\0') {
        pxVar4 = pxVar4 + 1;
        uVar3 = uVar3 ^ (long)(char)xVar5 + (uVar3 >> 3) + uVar3 * 0x20;
        xVar5 = *pxVar4;
      }
    }
    uVar3 = uVar3 % (ulong)(long)table->size;
    p_Var6 = table->table;
    if (p_Var6 == (_xmlHashEntry *)0x0 || p_Var6[uVar3].valid == 0) {
      return (void *)0x0;
    }
    p_Var6 = p_Var6 + uVar3;
    do {
      iVar1 = xmlStrQEqual(prefix,name,p_Var6->name);
      if (((iVar1 != 0) && (iVar1 = xmlStrQEqual(prefix2,name2,p_Var6->name2), iVar1 != 0)) &&
         (iVar1 = xmlStrQEqual(prefix3,name3,p_Var6->name3), iVar1 != 0)) {
        return p_Var6->payload;
      }
      p_Var6 = p_Var6->next;
    } while (p_Var6 != (_xmlHashEntry *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void *
xmlHashQLookup3(xmlHashTablePtr table,
                const xmlChar *prefix, const xmlChar *name,
		const xmlChar *prefix2, const xmlChar *name2,
		const xmlChar *prefix3, const xmlChar *name3) {
    unsigned long key;
    xmlHashEntryPtr entry;

    if (table == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);
    key = xmlHashComputeQKey(table, prefix, name, prefix2,
                             name2, prefix3, name3);
    if (table->table[key].valid == 0)
	return(NULL);
    for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
	if ((xmlStrQEqual(prefix, name, entry->name)) &&
	    (xmlStrQEqual(prefix2, name2, entry->name2)) &&
	    (xmlStrQEqual(prefix3, name3, entry->name3)))
	    return(entry->payload);
    }
    return(NULL);
}